

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_11x11(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  JSAMPROW pJVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int *local_100;
  int local_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar9 = (ulong)start_col;
  lVar14 = 0;
  local_100 = data;
  do {
    pJVar8 = sample_data[lVar14];
    uVar22 = (uint)pJVar8[uVar9] + (uint)pJVar8[uVar9 + 10];
    uVar18 = (uint)pJVar8[uVar9 + 1] + (uint)pJVar8[uVar9 + 9];
    uVar20 = (uint)pJVar8[uVar9 + 2] + (uint)pJVar8[uVar9 + 8];
    uVar10 = (uint)pJVar8[uVar9 + 3] + (uint)pJVar8[uVar9 + 7];
    lVar28 = (ulong)pJVar8[uVar9] - (ulong)pJVar8[uVar9 + 10];
    lVar15 = (ulong)pJVar8[uVar9 + 1] - (ulong)pJVar8[uVar9 + 9];
    uVar26 = (uint)pJVar8[uVar9 + 4] + (uint)pJVar8[uVar9 + 6];
    bVar1 = pJVar8[uVar9 + 5];
    lVar17 = (ulong)pJVar8[uVar9 + 2] - (ulong)pJVar8[uVar9 + 8];
    lVar29 = (ulong)pJVar8[uVar9 + 3] - (ulong)pJVar8[uVar9 + 7];
    lVar25 = (ulong)pJVar8[uVar9 + 4] - (ulong)pJVar8[uVar9 + 6];
    *local_100 = (uVar10 + uVar20 + uVar18 + uVar22 + (uint)bVar1 + uVar26) * 2 + -0xb00;
    uVar16 = (ulong)((uint)bVar1 + (uint)bVar1);
    lVar23 = uVar22 - uVar16;
    lVar19 = uVar18 - uVar16;
    lVar21 = uVar20 - uVar16;
    lVar11 = uVar10 - uVar16;
    lVar27 = uVar26 - uVar16;
    lVar24 = (lVar21 + lVar27) * 0x671 + (lVar23 + lVar11) * 0x2b6c;
    lVar12 = (lVar19 - lVar11) * 0x1da3;
    local_100[2] = (int)(lVar27 * 0xfffffffd37d + lVar11 * 0xfffffffdf6a + lVar12 + lVar24 + 0x800U
                        >> 0xc);
    lVar11 = (lVar23 - lVar19) * 0x2612;
    local_100[4] = (int)((ulong)(lVar21 * 0xfffffffd494 + lVar27 * 0x12cd + lVar12 +
                                lVar19 * 0x1ff + lVar11 + 0x800) >> 0xc);
    local_100[6] = (int)((ulong)(lVar11 + lVar23 * 0xfffffffcc25 + 0x800 + lVar21 * 0xfffffffe6c3 +
                                lVar24) >> 0xc);
    lVar23 = (lVar15 + lVar28) * 0x292a;
    lVar19 = (lVar28 + lVar17) * 0x2234;
    lVar11 = (lVar29 + lVar28) * 0x1877;
    lVar21 = (lVar15 + lVar17) * -0x1877;
    local_100[1] = (int)((ulong)(lVar23 + lVar28 * 0xfffffffc8f6 + 0x800 + lVar19 + lVar11 +
                                lVar25 * 0xcc0) >> 0xc);
    lVar12 = (lVar29 + lVar15) * -0x2ccb;
    local_100[3] = (int)((ulong)(lVar15 * 0x28d8 + lVar23 + 0x800 + lVar21 + lVar12 +
                                lVar25 * 0xfffffffddcc) >> 0xc);
    lVar15 = (lVar29 + lVar17) * 0xcc0;
    local_100[5] = (int)((ulong)(lVar25 * 0x2ccb + 0x800 +
                                lVar19 + lVar15 + lVar17 * -0x3fa6 + lVar21) >> 0xc);
    local_100[7] = (int)((ulong)(lVar25 * 0xfffffffd6d6 + 0x800 +
                                lVar12 + lVar11 + lVar29 * 0x29c7 + lVar15) >> 0xc);
    piVar13 = local_98;
    if ((int)lVar14 != 7) {
      if ((int)lVar14 == 10) {
        lVar14 = 0;
        do {
          iVar2 = aiStack_58[lVar14];
          iVar3 = data[lVar14];
          lVar24 = (long)(iVar2 + iVar3);
          iVar4 = local_98[lVar14];
          iVar5 = aiStack_78[lVar14];
          lVar19 = (long)(iVar5 + data[lVar14 + 8]);
          iVar6 = data[lVar14 + 0x10];
          lVar17 = (long)(iVar4 + iVar6);
          lVar12 = (long)(data[lVar14 + 0x38] + data[lVar14 + 0x18]);
          iVar7 = data[lVar14 + 0x20];
          lVar21 = (long)(data[lVar14 + 0x30] + iVar7);
          lVar11 = (long)data[lVar14 + 0x28];
          data[lVar14] = (DCTELEM)((lVar17 + lVar12 + lVar19 + lVar24 + lVar21 + lVar11) * 0x21da +
                                   0x4000U >> 0xf);
          lVar24 = lVar24 + lVar11 * -2;
          lVar19 = lVar19 + lVar11 * -2;
          lVar17 = lVar17 + lVar11 * -2;
          lVar12 = lVar12 + lVar11 * -2;
          lVar21 = lVar21 + lVar11 * -2;
          lVar15 = (lVar21 + lVar17) * 0x6d0 + (lVar24 + lVar12) * 0x2def;
          lVar11 = (lVar19 - lVar12) * 0x1f5a;
          data[lVar14 + 0x10] =
               (DCTELEM)(lVar21 * 0x7fffffffd0ea + lVar12 * 0x7fffffffdd87 + lVar11 + lVar15 +
                         0x4000U >> 0xf);
          lVar12 = (lVar24 - lVar19) * 0x2846;
          data[lVar14 + 0x20] =
               (DCTELEM)((ulong)(lVar17 * 0x7fffffffd211 + lVar21 * 0x13e3 + lVar11 +
                                lVar19 * 0x21c + lVar12 + 0x4000) >> 0xf);
          lVar21 = (long)(iVar3 - iVar2);
          lVar25 = (long)(data[lVar14 + 8] - iVar5);
          lVar23 = (long)(iVar6 - iVar4);
          lVar19 = (long)(data[lVar14 + 0x18] - data[lVar14 + 0x38]);
          lVar11 = (long)(iVar7 - data[lVar14 + 0x30]);
          data[lVar14 + 0x30] =
               (DCTELEM)((ulong)(lVar12 + lVar24 * 0x7fffffffc925 + 0x4000 + lVar17 * 0x7fffffffe54d
                                + lVar15) >> 0xf);
          lVar12 = (lVar25 + lVar21) * 0x2b8c;
          lVar24 = (lVar23 + lVar21) * 0x242e;
          lVar17 = (lVar19 + lVar21) * 0x19e2;
          lVar27 = (lVar23 + lVar25) * -0x19e2;
          data[lVar14 + 8] =
               (DCTELEM)((ulong)(lVar12 + lVar21 * 0x7fffffffc5c7 + 0x4000 + lVar24 + lVar17 +
                                lVar11 * 0xd7d) >> 0xf);
          lVar15 = (lVar19 + lVar25) * -0x2f63;
          data[lVar14 + 0x18] =
               (DCTELEM)((ulong)(lVar25 * 0x2b35 + lVar12 + 0x4000 + lVar27 + lVar15 +
                                lVar11 * 0x7fffffffdbd2) >> 0xf);
          lVar12 = (lVar23 + lVar19) * 0xd7d;
          data[lVar14 + 0x28] =
               (DCTELEM)((ulong)(lVar11 * 0x2f63 + 0x4000 +
                                lVar24 + lVar12 + lVar23 * -0x4355 + lVar27) >> 0xf);
          data[lVar14 + 0x38] =
               (DCTELEM)((ulong)(lVar11 * 0x7fffffffd474 + 0x4000 +
                                lVar15 + lVar17 + lVar19 * 0x2c32 + lVar12) >> 0xf);
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != 8);
        return;
      }
      piVar13 = local_100 + 8;
    }
    lVar14 = lVar14 + 1;
    local_100 = piVar13;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_11x11 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  INT32 z1, z2, z3;
  DCTELEM workspace[8*3];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/22). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[10]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[9]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[8]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[7]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[6]);
    tmp5 = GETJSAMPLE(elemptr[5]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[10]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[9]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[8]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[7]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 - 11 * CENTERJSAMPLE) << 1);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.356927976)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.201263574));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.926112931));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.189712156));        /* c4 */
    dataptr[2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.018300590)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.390975730)),        /* c4+c10 */
	      CONST_BITS-1);
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.062335650)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.356927976))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.587485545)),        /* c8 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.620527200)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.788749120)),        /* c8+c10 */
	      CONST_BITS-1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.286413905));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.068791298));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.764581576));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.719967871)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.398430003));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.764581576));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.399818907));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.276416582)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.068791298));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.398430003));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(1.989053629)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.399818907));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.305598626)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.286413905));         /* c3 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-1);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-1);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 11)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/11)**2 = 64/121, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/22) * 128/121.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*1];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*0];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*7];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*6];
    tmp5 = dataptr[DCTSIZE*5];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*2];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*1];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*0];
    tmp13 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*7];
    tmp14 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5,
		       FIX(1.057851240)),                /* 128/121 */
	      CONST_BITS+2);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.435427942)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.212906922));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.979689713));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.258538479));        /* c4 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.077210542)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.471445400)),        /* c4+c10 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.065941844)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.435427942))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.621472312)),        /* c8 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.714276708)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.834379234)),        /* c8+c10 */
	      CONST_BITS+2);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.360834544));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.130622199));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.808813568));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.819470145)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.421479672));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.808813568));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.480800167));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.350258864)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.130622199));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.421479672));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(2.104122847)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.480800167));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.381129125)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.360834544));         /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}